

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::GetMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  int number;
  uint32 uVar1;
  Descriptor *message_type;
  MessageLite *pMVar2;
  Message **ppMVar3;
  undefined8 *puVar4;
  _func_void_FieldDescriptor_ptr *local_38;
  FieldDescriptor *local_30;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_38 = FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_38,&local_30);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x43] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar1 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 0x44);
    message_type = FieldDescriptor::message_type(field);
    pMVar2 = internal::ExtensionSet::GetMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
                        number,message_type,factory);
  }
  else {
    ppMVar3 = GetRaw<google::protobuf::Message_const*>(this,message,field);
    pMVar2 = &(*ppMVar3)->super_MessageLite;
    if (pMVar2 == (MessageLite *)0x0) {
      puVar4 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(&this->schema_,field);
      pMVar2 = (MessageLite *)*puVar4;
    }
  }
  return (Message *)pMVar2;
}

Assistant:

const Message& Reflection::GetMessage(const Message& message,
                                      const FieldDescriptor* field,
                                      MessageFactory* factory) const {
  USAGE_CHECK_ALL(GetMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<const Message&>(GetExtensionSet(message).GetMessage(
        field->number(), field->message_type(), factory));
  } else {
    const Message* result = GetRaw<const Message*>(message, field);
    if (result == nullptr) {
      result = DefaultRaw<const Message*>(field);
    }
    return *result;
  }
}